

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_transaction_context.cpp
# Opt level: O1

void __thiscall
TransactionContext_VerifyErrorCheck_Test::TestBody(TransactionContext_VerifyErrorCheck_Test *this)

{
  ByteData *pBVar1;
  pointer pcVar2;
  pointer pcVar3;
  Script *this_00;
  pointer *ppuVar4;
  pointer pSVar5;
  bool bVar6;
  pointer *ppTVar7;
  long lVar8;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Privkey> __l_00;
  initializer_list<cfd::UtxoData> __l_01;
  initializer_list<cfd::SignParameter> __l_02;
  OutPoint outpoint3;
  SignParameter sign2;
  SigHashType sighash_type;
  OutPoint outpoint2;
  SignParameter sign1;
  ByteData256 sighash3;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> privkeys;
  OutPoint outpoint1;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> signatures3;
  ByteData signature1;
  ByteData signature2;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> pubkeys;
  AddressFactory factory;
  Script scriptSig;
  ByteData tx;
  TransactionContext txc;
  Address address;
  Address address2;
  AssertionResult gtest_ar;
  UtxoData utxo3;
  UtxoData utxo2;
  UtxoData utxo1;
  allocator_type local_2468 [16];
  OutPoint local_2458;
  pointer local_2430;
  undefined1 local_2428 [32];
  pointer local_2408;
  undefined **local_23e0;
  _Alloc_hider local_23d0;
  char local_23c0 [20];
  SigHashType local_23ac;
  OutPoint local_23a0;
  SignParameter local_2378;
  ByteData256 local_2300;
  vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_> local_22e8;
  OutPoint local_22d0;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_22a8;
  ByteData local_2290;
  ByteData local_2278;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_2260;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_2248;
  SigHashType local_222c;
  SigHashType local_2220;
  SigHashType local_2214;
  SigHashType local_2208;
  SigHashType local_21fc;
  AddressFactory local_21f0;
  Script local_21c8;
  ByteData local_2190;
  TransactionContext local_2178;
  undefined1 local_20c0 [32];
  undefined1 local_20a0 [16];
  pointer local_2090;
  pointer local_2078;
  pointer local_2060;
  TapBranch local_2048;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1fd0;
  Script local_1fb8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f78;
  undefined1 local_1f48 [32];
  undefined1 local_1f28 [16];
  pointer local_1f18;
  pointer local_1f00;
  pointer local_1ee8;
  TapBranch local_1ed0;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1e58;
  Script local_1e40;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e00;
  undefined1 local_1dd0 [16];
  undefined1 local_1dc0 [16];
  undefined1 local_1db0 [32];
  Privkey local_1d90;
  pointer local_1d70;
  TapBranch local_1d58;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_1ce0;
  Script local_1cc8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c88 [19];
  UtxoData local_18e0;
  UtxoData local_13f0;
  UtxoData local_f00;
  UtxoData local_a10;
  UtxoData local_520;
  
  cfd::AddressFactory::AddressFactory(&local_21f0,kRegtest);
  cfd::UtxoData::UtxoData(&local_520);
  local_520.block_height = 0;
  local_520.binary_data = (void *)0x0;
  pBVar1 = &local_a10.block_hash.data_;
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1dd0,(string *)&local_a10);
  cfd::core::Txid::operator=(&local_520.txid,(Txid *)local_1dd0);
  local_1dd0._0_8_ = &PTR__Txid_00735400;
  if ((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]));
  }
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  local_520.vout = 0;
  local_a10.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a10,"2NDdj5X7X7qS9LYZJPdD8tY4NZ7CZFR3Tbi","");
  cfd::AddressFactory::GetAddress((Address *)local_1dd0,&local_21f0,(string *)&local_a10);
  cfd::core::Address::operator=(&local_520.address,(Address *)local_1dd0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1c88);
  cfd::core::Script::~Script(&local_1cc8);
  local_1d58._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1ce0)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1d58);
  if (local_1d70 != (pointer)0x0) {
    operator_delete(local_1d70);
  }
  if ((_func_int **)
      local_1d90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != (_func_int **)0x0) {
    operator_delete(local_1d90.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_1db0._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_1db0._16_8_);
  }
  if ((Privkey *)local_1dc0._0_8_ != (Privkey *)local_1db0) {
    operator_delete((void *)local_1dc0._0_8_);
  }
  if ((ByteData *)local_a10.block_height != pBVar1) {
    operator_delete((void *)local_a10.block_height);
  }
  cfd::core::Address::GetLockingScript((Script *)local_1dd0,&local_520.address);
  cfd::core::Script::operator=(&local_520.locking_script,(Script *)local_1dd0);
  cfd::core::Script::~Script((Script *)local_1dd0);
  std::__cxx11::string::_M_replace
            ((ulong)&local_520.descriptor,0,(char *)local_520.descriptor._M_string_length,0x55b8cd);
  cfd::core::Amount::Amount((Amount *)local_1dd0,10000000);
  local_520.amount.ignore_check_ = local_1dd0[8];
  local_520.amount.amount_ = local_1dd0._0_8_;
  local_520.address_type = kP2shP2wpkhAddress;
  cfd::UtxoData::UtxoData(&local_a10);
  local_a10.block_height = 0;
  local_a10.binary_data = (void *)0x0;
  pBVar1 = &local_f00.block_hash.data_;
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1dd0,(string *)&local_f00);
  cfd::core::Txid::operator=(&local_a10.txid,(Txid *)local_1dd0);
  local_1dd0._0_8_ = &PTR__Txid_00735400;
  if ((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]));
  }
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  local_a10.vout = 2;
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"bcrt1qeh098dzrl5d5n50duth76uhv9mr9fq9309ymtn","");
  cfd::AddressFactory::GetAddress((Address *)local_1dd0,&local_21f0,(string *)&local_f00);
  cfd::core::Address::operator=(&local_a10.address,(Address *)local_1dd0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1c88);
  cfd::core::Script::~Script(&local_1cc8);
  local_1d58._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_00740b18;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1ce0)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1d58);
  if (local_1d70 != (pointer)0x0) {
    operator_delete(local_1d70);
  }
  if ((_func_int **)
      local_1d90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != (_func_int **)0x0) {
    operator_delete(local_1d90.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_1db0._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_1db0._16_8_);
  }
  if ((Privkey *)local_1dc0._0_8_ != (Privkey *)local_1db0) {
    operator_delete((void *)local_1dc0._0_8_);
  }
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  cfd::core::Address::GetLockingScript((Script *)local_1dd0,&local_a10.address);
  cfd::core::Script::operator=(&local_a10.locking_script,(Script *)local_1dd0);
  cfd::core::Script::~Script((Script *)local_1dd0);
  std::__cxx11::string::_M_replace
            ((ulong)&local_a10.descriptor,0,(char *)local_a10.descriptor._M_string_length,0x55b947);
  cfd::core::Amount::Amount((Amount *)local_1dd0,10000);
  local_a10.amount.ignore_check_ = local_1dd0[8];
  local_a10.amount.amount_ = local_1dd0._0_8_;
  local_a10.address_type = kP2wpkhAddress;
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,
             "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27","");
  local_2430 = (pointer)&PTR__TaprootScriptTree_00740b18;
  cfd::core::Pubkey::Pubkey((Pubkey *)local_1dd0,(string *)&local_f00);
  pcVar2 = local_20c0 + 0x10;
  local_20c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,
             "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_1dc0 + 8),(string *)local_20c0);
  pcVar3 = local_1f48 + 0x10;
  local_1f48._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f48,
             "03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae","");
  cfd::core::Pubkey::Pubkey((Pubkey *)(local_1db0 + 0x10),(string *)local_1f48);
  __l._M_len = 3;
  __l._M_array = (iterator)local_1dd0;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_2248,__l,(allocator_type *)&local_2178);
  lVar8 = 0x30;
  do {
    if (*(void **)(local_1dd0 + lVar8) != (void *)0x0) {
      operator_delete(*(void **)(local_1dd0 + lVar8));
    }
    lVar8 = lVar8 + -0x18;
  } while (lVar8 != -0x18);
  if ((pointer)local_1f48._0_8_ != pcVar3) {
    operator_delete((void *)local_1f48._0_8_);
  }
  if ((pointer)local_20c0._0_8_ != pcVar2) {
    operator_delete((void *)local_20c0._0_8_);
  }
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  local_f00.block_height = (uint64_t)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f00,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP","");
  cfd::core::Privkey::FromWif((Privkey *)local_1dd0,(string *)&local_f00,kTestnet,true);
  local_20c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt","");
  cfd::core::Privkey::FromWif((Privkey *)local_1db0,(string *)local_20c0,kTestnet,true);
  local_1f48._0_8_ = pcVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1f48,"cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9","");
  cfd::core::Privkey::FromWif(&local_1d90,(string *)local_1f48,kTestnet,true);
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)local_1dd0;
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::vector
            (&local_22e8,__l_00,(allocator_type *)&local_2178);
  lVar8 = 0x60;
  do {
    if (*(void **)(local_1dd0 + lVar8 + -0x20) != (void *)0x0) {
      operator_delete(*(void **)(local_1dd0 + lVar8 + -0x20));
    }
    lVar8 = lVar8 + -0x20;
  } while (lVar8 != 0);
  if ((pointer)local_1f48._0_8_ != pcVar3) {
    operator_delete((void *)local_1f48._0_8_);
  }
  if ((pointer)local_20c0._0_8_ != pcVar2) {
    operator_delete((void *)local_20c0._0_8_);
  }
  if ((ByteData *)local_f00.block_height != pBVar1) {
    operator_delete((void *)local_f00.block_height);
  }
  cfd::UtxoData::UtxoData(&local_f00);
  local_f00.block_height = 0;
  local_f00.binary_data = (void *)0x0;
  local_20c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_20c0,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1dd0,(string *)local_20c0);
  cfd::core::Txid::operator=(&local_f00.txid,(Txid *)local_1dd0);
  local_1dd0._0_8_ = &PTR__Txid_00735400;
  if ((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1dd0._9_7_,local_1dd0[8]));
  }
  if ((pointer)local_20c0._0_8_ != pcVar2) {
    operator_delete((void *)local_20c0._0_8_);
  }
  local_f00.vout = 1;
  cfd::core::ScriptUtil::CreateMultisigRedeemScript((Script *)local_1dd0,2,&local_2248,true);
  this_00 = &local_f00.redeem_script;
  cfd::core::Script::operator=(this_00,(Script *)local_1dd0);
  cfd::core::Script::~Script((Script *)local_1dd0);
  cfd::AddressFactory::CreateP2shAddress((Address *)local_1dd0,&local_21f0,this_00);
  cfd::core::Address::operator=(&local_f00.address,(Address *)local_1dd0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(local_1c88);
  cfd::core::Script::~Script(&local_1cc8);
  local_1d58._vptr_TapBranch = (_func_int **)local_2430;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1ce0)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1d58);
  if (local_1d70 != (pointer)0x0) {
    operator_delete(local_1d70);
  }
  if ((_func_int **)
      local_1d90.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_finish != (_func_int **)0x0) {
    operator_delete(local_1d90.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  if ((pointer)local_1db0._16_8_ != (pointer)0x0) {
    operator_delete((void *)local_1db0._16_8_);
  }
  if ((Privkey *)local_1dc0._0_8_ != (Privkey *)local_1db0) {
    operator_delete((void *)local_1dc0._0_8_);
  }
  cfd::core::Address::GetLockingScript((Script *)local_1dd0,&local_f00.address);
  cfd::core::Script::operator=(&local_f00.locking_script,(Script *)local_1dd0);
  cfd::core::Script::~Script((Script *)local_1dd0);
  std::__cxx11::string::_M_replace
            ((ulong)&local_f00.descriptor,0,(char *)local_f00.descriptor._M_string_length,0x55b990);
  cfd::core::Amount::Amount((Amount *)local_1dd0,180000);
  local_f00.amount.ignore_check_ = local_1dd0[8];
  local_f00.amount.amount_ = local_1dd0._0_8_;
  local_f00.address_type = kP2wshAddress;
  local_1dd0._0_8_ = local_1dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1dd0,"mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo","");
  cfd::core::Address::Address((Address *)local_20c0,(string *)local_1dd0);
  if ((undefined1 *)local_1dd0._0_8_ != local_1dc0) {
    operator_delete((void *)local_1dd0._0_8_);
  }
  local_1dd0._0_8_ = local_1dc0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1dd0,"bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu","");
  cfd::core::Address::Address((Address *)local_1f48,(string *)local_1dd0);
  if ((undefined1 *)local_1dd0._0_8_ != local_1dc0) {
    operator_delete((void *)local_1dd0._0_8_);
  }
  cfd::TransactionContext::TransactionContext(&local_2178,2,0);
  cfd::UtxoData::UtxoData((UtxoData *)local_1dd0,&local_520);
  cfd::UtxoData::UtxoData(&local_18e0,&local_a10);
  cfd::UtxoData::UtxoData(&local_13f0,&local_f00);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_1dd0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (&local_2260,__l_01,(allocator_type *)local_2428);
  lVar8 = 0x9e0;
  do {
    cfd::UtxoData::~UtxoData((UtxoData *)(local_1dd0 + lVar8));
    lVar8 = lVar8 + -0x4f0;
  } while (lVar8 != -0x4f0);
  cfd::core::SigHashType::SigHashType(&local_23ac);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::TransactionContext::AddInputs(&local_2178,&local_2260);
    }
  }
  else {
    testing::Message::Message((Message *)local_1dd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x287,
               "Expected: txc.AddInputs(utxos) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2428,(Message *)local_1dd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2428);
    if ((_func_int **)local_1dd0._0_8_ != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((_func_int **)local_1dd0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_1dd0._0_8_ + 8))();
      }
      local_1dd0._0_8_ = (_func_int **)0x0;
    }
  }
  cfd::TransactionContext::AddTxOut(&local_2178,(Address *)local_20c0,&local_520.amount);
  cfd::TransactionContext::AddTxOut(&local_2178,(Address *)local_1f48,&local_a10.amount);
  cfd::core::ByteData::ByteData(&local_2190);
  cfd::core::OutPoint::OutPoint(&local_22d0,&local_520.txid,local_520.vout);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      local_1dd0._0_8_ = local_1dc0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1dd0,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_21c8,(string *)local_1dd0);
      ppuVar4 = (pointer *)
                ((long)&local_2378.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
      local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2378,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif((Privkey *)local_2428,(string *)&local_2378,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_21fc);
      cfd::TransactionContext::SignWithKey
                (&local_2178,&local_22d0,(Pubkey *)&local_21c8,(Privkey *)local_2428,&local_21fc,
                 true,(ByteData256 *)0x0,(ByteData *)0x0);
      if ((AssertHelperData *)local_2428._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_2428._0_8_);
      }
      if ((pointer *)
          local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != ppuVar4) {
        operator_delete(local_2378.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_21c8._vptr_Script != (_func_int **)0x0) {
        operator_delete(local_21c8._vptr_Script);
      }
      if ((undefined1 *)local_1dd0._0_8_ != local_1dc0) {
        operator_delete((void *)local_1dd0._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1dd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x292,
               "Expected: txc.SignWithKey(outpoint1, Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2428,(Message *)local_1dd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2428);
    if ((_func_int **)local_1dd0._0_8_ != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((_func_int **)local_1dd0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_1dd0._0_8_ + 8))();
      }
      local_1dd0._0_8_ = (_func_int **)0x0;
    }
  }
  local_2428._0_8_ = (AssertHelperData *)(local_2428 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2428,
             "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281","");
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_2458,(string *)local_2428);
  cfd::core::ScriptUtil::CreateP2wpkhLockingScript((Script *)local_1dd0,(Pubkey *)&local_2458);
  cfd::core::Script::GetData((ByteData *)&local_23a0,(Script *)local_1dd0);
  cfd::core::ByteData::Serialize(&local_2378.data_,(ByteData *)&local_23a0);
  cfd::core::Script::Script(&local_21c8,&local_2378.data_);
  if ((pointer *)
      local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_2378.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_23a0.txid_._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_23a0.txid_._vptr_Txid);
  }
  cfd::core::Script::~Script((Script *)local_1dd0);
  if (local_2458.txid_._vptr_Txid != (_func_int **)0x0) {
    operator_delete(local_2458.txid_._vptr_Txid);
  }
  if ((AssertHelperData *)local_2428._0_8_ != (AssertHelperData *)(local_2428 + 0x10)) {
    operator_delete((void *)local_2428._0_8_);
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      cfd::core::Transaction::SetUnlockingScript(&local_2178.super_Transaction,0,&local_21c8);
    }
  }
  else {
    testing::Message::Message((Message *)local_1dd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x296,
               "Expected: txc.SetUnlockingScript(0, scriptSig) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2428,(Message *)local_1dd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2428);
    if ((_func_int **)local_1dd0._0_8_ != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((_func_int **)local_1dd0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_1dd0._0_8_ + 8))();
      }
      local_1dd0._0_8_ = (_func_int **)0x0;
    }
  }
  cfd::TransactionContext::Verify(&local_2178,&local_22d0);
  cfd::core::OutPoint::OutPoint(&local_23a0,&local_a10.txid,local_a10.vout);
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    bVar6 = testing::internal::AlwaysTrue();
    if (bVar6) {
      local_1dd0._0_8_ = local_1dc0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1dd0,
                 "020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281","");
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_2458,(string *)local_1dd0);
      ppuVar4 = (pointer *)
                ((long)&local_2378.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 0x10);
      local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)ppuVar4;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_2378,"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt","");
      cfd::core::Privkey::FromWif((Privkey *)local_2428,(string *)&local_2378,kTestnet,true);
      cfd::core::SigHashType::SigHashType(&local_2208);
      cfd::TransactionContext::SignWithKey
                (&local_2178,&local_23a0,(Pubkey *)&local_2458,(Privkey *)local_2428,&local_2208,
                 true,(ByteData256 *)0x0,(ByteData *)0x0);
      if ((AssertHelperData *)local_2428._0_8_ != (AssertHelperData *)0x0) {
        operator_delete((void *)local_2428._0_8_);
      }
      if ((pointer *)
          local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != ppuVar4) {
        operator_delete(local_2378.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_2458.txid_._vptr_Txid != (_func_int **)0x0) {
        operator_delete(local_2458.txid_._vptr_Txid);
      }
      if ((undefined1 *)local_1dd0._0_8_ != local_1dc0) {
        operator_delete((void *)local_1dd0._0_8_);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_1dd0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_2428,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_transaction_context.cpp"
               ,0x2a2,
               "Expected: txc.SignWithKey(outpoint2, Pubkey(\"020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281\"), Privkey::FromWif( \"cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_2428,(Message *)local_1dd0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_2428);
    if ((_func_int **)local_1dd0._0_8_ != (_func_int **)0x0) {
      bVar6 = testing::internal::IsTrue(true);
      if ((bVar6) && ((_func_int **)local_1dd0._0_8_ != (_func_int **)0x0)) {
        (**(code **)(*(_func_int **)local_1dd0._0_8_ + 8))();
      }
      local_1dd0._0_8_ = (_func_int **)0x0;
    }
  }
  cfd::TransactionContext::Verify(&local_2178,&local_23a0);
  cfd::core::OutPoint::OutPoint(&local_2458,&local_f00.txid,local_f00.vout);
  cfd::core::SigHashType::SigHashType(&local_2214,&local_23ac);
  cfd::TransactionContext::CreateSignatureHash
            ((ByteData *)local_1dd0,&local_2178,&local_2458,this_00,&local_2214,&local_f00.amount,
             kVersion0);
  cfd::core::ByteData256::ByteData256(&local_2300,(ByteData *)local_1dd0);
  if ((_func_int **)local_1dd0._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_1dd0._0_8_);
  }
  cfd::core::SignatureUtil::CalculateEcSignature
            (&local_2278,&local_2300,
             local_22e8.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 2,true);
  cfd::core::SignatureUtil::CalculateEcSignature
            (&local_2290,&local_2300,
             local_22e8.super__Vector_base<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>.
             _M_impl.super__Vector_impl_data._M_start + 1,true);
  cfd::core::SigHashType::SigHashType(&local_2220,&local_23ac);
  cfd::SignParameter::SignParameter((SignParameter *)local_2428,&local_2278,true,&local_2220);
  cfd::core::SigHashType::SigHashType(&local_222c,&local_23ac);
  cfd::SignParameter::SignParameter(&local_2378,&local_2290,true,&local_222c);
  cfd::SignParameter::SignParameter((SignParameter *)local_1dd0,(SignParameter *)local_2428);
  cfd::SignParameter::SignParameter((SignParameter *)&local_1d58,&local_2378);
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)local_1dd0;
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::vector
            (&local_22a8,__l_02,local_2468);
  lVar8 = -0xf0;
  ppTVar7 = &local_1d58.branch_list_.
             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl
             .super__Vector_impl_data._M_finish;
  do {
    ppTVar7[-4] = (pointer)&PTR__ScriptOperator_00734d50;
    if ((pointer)ppTVar7 != ppTVar7[-2]) {
      operator_delete(ppTVar7[-2]);
    }
    if (ppTVar7[-9] != (pointer)0x0) {
      operator_delete(ppTVar7[-9]);
    }
    if (ppTVar7[-0xd] != (pointer)0x0) {
      operator_delete(ppTVar7[-0xd]);
    }
    ppTVar7 = ppTVar7 + -0xf;
    lVar8 = lVar8 + 0x78;
  } while (lVar8 != 0);
  cfd::TransactionContext::AddMultisigSign
            (&local_2178,&local_2458,&local_22a8,this_00,local_f00.address_type);
  cfd::TransactionContext::Verify(&local_2178,&local_2458);
  std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_22a8);
  local_2378.op_code_._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_00734d50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2378.op_code_.text_data_._M_dataplus._M_p != &local_2378.op_code_.text_data_.field_2)
  {
    operator_delete(local_2378.op_code_.text_data_._M_dataplus._M_p);
  }
  if (local_2378.related_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2378.related_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer *)
      local_2378.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer *)0x0) {
    operator_delete(local_2378.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_23e0 = &PTR__ScriptOperator_00734d50;
  if (local_23d0._M_p != local_23c0) {
    operator_delete(local_23d0._M_p);
  }
  if (local_2408 != (pointer)0x0) {
    operator_delete(local_2408);
  }
  if ((AssertHelperData *)local_2428._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_2428._0_8_);
  }
  if (local_2290.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2290.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2278.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2278.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2300.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2300.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_2458.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_2458.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2458.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_23a0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_23a0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_23a0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Script::~Script(&local_21c8);
  local_22d0.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_22d0.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_22d0.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  pSVar5 = local_2430;
  if (local_2190.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2190.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_2260);
  cfd::TransactionContext::~TransactionContext(&local_2178);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1e00);
  cfd::core::Script::~Script(&local_1e40);
  local_1ed0._vptr_TapBranch = (_func_int **)pSVar5;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1e58)
  ;
  cfd::core::TapBranch::~TapBranch(&local_1ed0);
  if (local_1ee8 != (pointer)0x0) {
    operator_delete(local_1ee8);
  }
  if (local_1f00 != (pointer)0x0) {
    operator_delete(local_1f00);
  }
  if (local_1f18 != (pointer)0x0) {
    operator_delete(local_1f18);
  }
  if ((undefined1 *)local_1f48._16_8_ != local_1f28) {
    operator_delete((void *)local_1f48._16_8_);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_1f78);
  cfd::core::Script::~Script(&local_1fb8);
  local_2048._vptr_TapBranch = (_func_int **)pSVar5;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_1fd0)
  ;
  cfd::core::TapBranch::~TapBranch(&local_2048);
  if (local_2060 != (pointer)0x0) {
    operator_delete(local_2060);
  }
  if (local_2078 != (pointer)0x0) {
    operator_delete(local_2078);
  }
  if (local_2090 != (pointer)0x0) {
    operator_delete(local_2090);
  }
  if ((undefined1 *)local_20c0._16_8_ != local_20a0) {
    operator_delete((void *)local_20c0._16_8_);
  }
  cfd::UtxoData::~UtxoData(&local_f00);
  std::vector<cfd::core::Privkey,_std::allocator<cfd::core::Privkey>_>::~vector(&local_22e8);
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_2248);
  cfd::UtxoData::~UtxoData(&local_a10);
  cfd::UtxoData::~UtxoData(&local_520);
  local_21f0._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_00733578;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_21f0.prefix_list_);
  return;
}

Assistant:

TEST(TransactionContext, VerifyErrorCheck)
{
  AddressFactory factory(NetType::kRegtest);
  // Address1 (p2sh-p2wpkh)
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  // dummy pubkey: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // dummy privkey: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.address = factory.GetAddress("2NDdj5X7X7qS9LYZJPdD8tY4NZ7CZFR3Tbi");
  utxo1.locking_script = utxo1.address.GetLockingScript();
  utxo1.descriptor = "sh(wpkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b))";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2shP2wpkhAddress;

  // Address2 (p2wpkh)
  // pubkey: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  // dummy pubkey: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // dummy privkey: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 2;
  utxo2.address = factory.GetAddress("bcrt1qeh098dzrl5d5n50duth76uhv9mr9fq9309ymtn");
  utxo2.locking_script = utxo2.address.GetLockingScript();
  utxo2.descriptor = "wpkh(03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae)";
  utxo2.amount = Amount(int64_t{10000});
  utxo2.address_type = AddressType::kP2wpkhAddress;

  // Address3 (2 of 3 multisig)
  // pubkey1: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey1: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // pubkey2: '020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281',
  // privkey2: 'cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt'
  // pubkey3: '03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae',
  // privkey3: 'cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9'
  std::vector<Pubkey> pubkeys = {
    Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
    Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
    Pubkey("03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae")
  };
  std::vector<Privkey> privkeys = {
    Privkey::FromWif("cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet),
    Privkey::FromWif("cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet),
    Privkey::FromWif("cP3zjeHXgPnu3KJH4nLRbNSKbVnZgb92sPiC9ciJcsnWkubq2ny9", NetType::kTestnet)
  };
  UtxoData utxo3;
  utxo3.block_height = 0;
  utxo3.binary_data = nullptr;
  utxo3.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo3.vout = 1;
  utxo3.redeem_script = ScriptUtil::CreateMultisigRedeemScript(2, pubkeys);
  utxo3.address = factory.CreateP2shAddress(utxo3.redeem_script);
  utxo3.locking_script = utxo3.address.GetLockingScript();
  utxo3.descriptor = "wsh(multi(2,0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27,020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281,03ebb70cf8b4adfff5559794d2e972d55c9429dbda25cd5911615dcab422d031ae))";
  utxo3.amount = Amount(int64_t{180000});
  utxo3.address_type = AddressType::kP2wshAddress;

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  Address address("mtmTFSnUTqGt6AaSqoRemj7ePPZ6YGXWeo");
  // "0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"
  Address address2("bcrt1qg4nrukf07cf4slc0m4h8gq6v2guhzrw29sfnlu");

  TransactionContext txc(2, 0);
  std::vector<cfd::UtxoData> utxos{utxo1, utxo2, utxo3};
  SigHashType sighash_type;

  EXPECT_NO_THROW(txc.AddInputs(utxos));
  txc.AddTxOut(address, utxo1.amount);
  txc.AddTxOut(address2, utxo2.amount);

  ByteData tx;

  // sign1
  OutPoint outpoint1(utxo1.txid, utxo1.vout);
  EXPECT_NO_THROW(txc.SignWithKey(outpoint1,
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  Script scriptSig(ScriptUtil::CreateP2wpkhLockingScript(
      Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"))
        .GetData().Serialize());
  EXPECT_NO_THROW(txc.SetUnlockingScript(0, scriptSig));
  try {
    txc.Verify(outpoint1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("p2sh-p2wpkh scriptsig unmatch.", except.what());
  }

  // sign2
  OutPoint outpoint2(utxo2.txid, utxo2.vout);
  EXPECT_NO_THROW(txc.SignWithKey(outpoint2,
      Pubkey("020bc943cfbc6fb8eb668b3516c920bad7f46bd227032fa4f00b72eb55197f2281"),
      Privkey::FromWif(
          "cQqnH8e9qzHDAVfYHRwH3X7mDrvz9tw3v1EEYw5tfkzWbTpbsgvt", NetType::kTestnet)));
  try {
    txc.Verify(outpoint2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Unmatch locking script.", except.what());
  }

  // sign3
  OutPoint outpoint3(utxo3.txid, utxo3.vout);
  ByteData256 sighash3 = ByteData256(txc.CreateSignatureHash(outpoint3,
      utxo3.redeem_script, sighash_type, utxo3.amount, WitnessVersion::kVersion0));
  ByteData signature2 = SignatureUtil::CalculateEcSignature(sighash3, privkeys[2]);
  ByteData signature1 = SignatureUtil::CalculateEcSignature(sighash3, privkeys[1]);
  SignParameter sign2(signature2, true, sighash_type);
  SignParameter sign1(signature1, true, sighash_type);
  std::vector<SignParameter> signatures3 = {sign2, sign1};
  txc.AddMultisigSign(
      outpoint3, signatures3, utxo3.redeem_script, utxo3.address_type);
  try {
    txc.Verify(outpoint3);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Signature order is incorrect.", except.what());
  }
}